

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_set.c
# Opt level: O3

dictionary_group_t dictionary_set_new_group(dictionary_set_t t_dictionary)

{
  long lVar1;
  dictionary_group_t pvVar2;
  dictionary_set_desc *dictionary_set;
  
  pvVar2 = (dictionary_group_t)0xffffffffffffffff;
  if (*t_dictionary != 0x7f) {
    pvVar2 = dictionary_group_open();
    lVar1 = *t_dictionary;
    *(long *)t_dictionary = lVar1 + 1;
    *(dictionary_group_t *)((long)t_dictionary + lVar1 * 8 + 8) = pvVar2;
  }
  return pvVar2;
}

Assistant:

dictionary_group_t dictionary_set_new_group(dictionary_set_t t_dictionary)
{
	dictionary_set_desc * dictionary_set = (dictionary_set_desc *) t_dictionary;

	if (dictionary_set->count + 1 == DICTIONARY_GROUP_MAX_COUNT)
	{
		return (dictionary_group_t) -1;
	}

	dictionary_group_t group = dictionary_group_open();
	dictionary_set->groups[dictionary_set->count ++] = group;

	return group;
}